

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset_test.c
# Opt level: O0

long test_callback_func(void *cb_data,float **data)

{
  undefined8 local_30;
  long frames;
  TEST_CB_DATA *pcb_data;
  float **data_local;
  void *cb_data_local;
  
  if (cb_data == (void *)0x0) {
    cb_data_local = (void *)0x0;
  }
  else if (data == (float **)0x0) {
    cb_data_local = (void *)0x0;
  }
  else {
    if (*(long *)((long)cb_data + 0x10) - *(long *)((long)cb_data + 8) < 1) {
      local_30 = (void *)0x0;
    }
    else {
      local_30 = (void *)(*(long *)((long)cb_data + 0x10) - *(long *)((long)cb_data + 8));
    }
    *data = (float *)(*(long *)((long)cb_data + 0x18) + *(long *)((long)cb_data + 8) * 4);
    *(long *)((long)cb_data + 8) = (long)local_30 + *(long *)((long)cb_data + 8);
    cb_data_local = local_30;
  }
  return (long)cb_data_local;
}

Assistant:

static long
test_callback_func (void *cb_data, float **data)
{	TEST_CB_DATA *pcb_data ;

	long frames ;

	if ((pcb_data = cb_data) == NULL)
		return 0 ;

	if (data == NULL)
		return 0 ;

	if (pcb_data->total - pcb_data->count > 0)
		frames = pcb_data->total - pcb_data->count ;
	else
		frames = 0 ;

	*data = pcb_data->data + pcb_data->count ;
	pcb_data->count += frames ;

	return frames ;
}